

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoLinear> *this,TPZVec<long> *nodeindexes)

{
  long lVar1;
  
  TPZGeoLinear::TPZGeoLinear(&this->super_TPZGeoLinear,&PTR_PTR_016c42f8,nodeindexes);
  (this->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_016c42a0;
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x30);
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&this->field_0x50);
  TPZTransform<double>::TPZTransform((TPZTransform<double> *)&this->field_0x1f0);
  return;
}

Assistant:

TPZGeoBlend(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZGeoBlend::ClassId),
                                                    TGeo(nodeindexes) {
        }